

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stmt.h
# Opt level: O0

void __thiscall enact::ContinueStmt::~ContinueStmt(ContinueStmt *this)

{
  ContinueStmt *this_local;
  
  ~ContinueStmt(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

~ContinueStmt() override = default;